

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression *
slang::ast::tryBindSpecialMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view methodName;
  string_view methodName_00;
  bool bVar1;
  RandMode RVar2;
  Symbol *pSVar3;
  Expression *in_RCX;
  undefined8 in_RDX;
  Compilation *in_RSI;
  size_t in_RDI;
  InvocationExpressionSyntax *in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000010;
  ASTContext *in_stack_00000018;
  Symbol *sym;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Symbol *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb0;
  Expression *in_stack_ffffffffffffffb8;
  SymbolKind rootKind;
  char *in_stack_fffffffffffffff8;
  Expression *pEVar5;
  
  rootKind = (SymbolKind)((ulong)in_RDX >> 0x20);
  pSVar3 = Expression::getSymbolReference
                     (in_stack_ffffffffffffffb8,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
  if (pSVar3 == (Symbol *)0x0) {
    pEVar5 = (Expression *)0x0;
  }
  else {
    bVar4 = sv(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __x._M_str = (char *)bVar4._M_len;
    __x._M_len = in_stack_ffffffffffffff98;
    bVar4._M_str = in_stack_ffffffffffffff90;
    bVar4._M_len = in_stack_ffffffffffffff88;
    bVar1 = std::operator==(__x,bVar4);
    if (bVar1) {
      RVar2 = Symbol::getRandMode(in_stack_ffffffffffffff78);
      if (RVar2 == None) {
        pEVar5 = (Expression *)0x0;
      }
      else {
        methodName._M_str = in_stack_fffffffffffffff8;
        methodName._M_len = in_RDI;
        pEVar5 = CallExpression::fromBuiltInMethod
                           (in_RSI,rootKind,in_RCX,methodName,in_R8,in_stack_00000010,
                            in_stack_00000018);
      }
    }
    else {
      methodName_00._M_str = in_stack_fffffffffffffff8;
      methodName_00._M_len = in_RDI;
      pEVar5 = CallExpression::fromBuiltInMethod
                         (in_RSI,rootKind,in_RCX,methodName_00,in_R8,in_stack_00000010,
                          in_stack_00000018);
    }
  }
  return pEVar5;
}

Assistant:

static Expression* tryBindSpecialMethod(Compilation& compilation, const Expression& expr,
                                        const LookupResult::MemberSelector& selector,
                                        const InvocationExpressionSyntax* invocation,
                                        const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                        const ASTContext& context) {
    auto sym = expr.getSymbolReference();
    if (!sym)
        return nullptr;

    // There is a built-in 'rand_mode' method that is present on every 'rand' and 'randc'
    // class property, and additionally on subelements of those properties.
    if (selector.name == "rand_mode"sv) {
        if (sym->getRandMode() == RandMode::None)
            return nullptr;

        return CallExpression::fromBuiltInMethod(compilation, SymbolKind::ClassProperty, expr,
                                                 selector.name, invocation, withClause, context);
    }

    return CallExpression::fromBuiltInMethod(compilation, sym->kind, expr, selector.name,
                                             invocation, withClause, context);
}